

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

Span<const_CRPCCommand> wallet::GetWalletRPCCommands(void)

{
  int iVar1;
  long in_FS_OFFSET;
  Span<const_CRPCCommand> SVar2;
  string in_stack_fffffffffffff6f8;
  allocator<char> local_8e8;
  allocator<char> local_8e7;
  allocator<char> local_8e6;
  allocator<char> local_8e5;
  allocator<char> local_8e4;
  allocator<char> local_8e3;
  allocator<char> local_8e2;
  allocator<char> local_8e1;
  allocator<char> local_8e0;
  allocator<char> local_8df;
  allocator<char> local_8de;
  allocator<char> local_8dd;
  allocator<char> local_8dc;
  allocator<char> local_8db;
  allocator<char> local_8da;
  allocator<char> local_8d9;
  allocator<char> local_8d8;
  allocator<char> local_8d7;
  allocator<char> local_8d6;
  allocator<char> local_8d5;
  allocator<char> local_8d4;
  allocator<char> local_8d3;
  allocator<char> local_8d2;
  allocator<char> local_8d1;
  allocator<char> local_8d0;
  allocator<char> local_8cf;
  allocator<char> local_8ce;
  allocator<char> local_8cd;
  allocator<char> local_8cc;
  allocator<char> local_8cb;
  allocator<char> local_8ca;
  allocator<char> local_8c9;
  allocator<char> local_8c8;
  allocator<char> local_8c7;
  allocator<char> local_8c6;
  allocator<char> local_8c5;
  allocator<char> local_8c4;
  allocator<char> local_8c3;
  allocator<char> local_8c2;
  allocator<char> local_8c1;
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (GetWalletRPCCommands()::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&GetWalletRPCCommands()::commands);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>(local_40,"rawtransactions",&local_8c1);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands,in_stack_fffffffffffff6f8,(RpcMethodFnType)local_40)
      ;
      std::__cxx11::string::string<std::allocator<char>>(local_60,"wallet",&local_8c2);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 1,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_60);
      std::__cxx11::string::string<std::allocator<char>>(local_80,"wallet",&local_8c3);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 2,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_80);
      std::__cxx11::string::string<std::allocator<char>>(local_a0,"wallet",&local_8c4);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 3,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_a0);
      std::__cxx11::string::string<std::allocator<char>>(local_c0,"wallet",&local_8c5);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 4,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_c0);
      std::__cxx11::string::string<std::allocator<char>>(local_e0,"wallet",&local_8c6);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 5,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_e0);
      std::__cxx11::string::string<std::allocator<char>>(local_100,"wallet",&local_8c7);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 6,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_100);
      std::__cxx11::string::string<std::allocator<char>>(local_120,"wallet",&local_8c8);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 7,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_120);
      std::__cxx11::string::string<std::allocator<char>>(local_140,"wallet",&local_8c9);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 8,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_140);
      std::__cxx11::string::string<std::allocator<char>>(local_160,"wallet",&local_8ca);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 9,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_160);
      std::__cxx11::string::string<std::allocator<char>>(local_180,"wallet",&local_8cb);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 10,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_180);
      std::__cxx11::string::string<std::allocator<char>>(local_1a0,"wallet",&local_8cc);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0xb,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>(local_1c0,"wallet",&local_8cd);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0xc,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_1c0);
      std::__cxx11::string::string<std::allocator<char>>(local_1e0,"wallet",&local_8ce);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0xd,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_1e0);
      std::__cxx11::string::string<std::allocator<char>>(local_200,"wallet",&local_8cf);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0xe,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_200);
      std::__cxx11::string::string<std::allocator<char>>(local_220,"wallet",&local_8d0);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0xf,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_220);
      std::__cxx11::string::string<std::allocator<char>>(local_240,"wallet",&local_8d1);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x10,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_240);
      std::__cxx11::string::string<std::allocator<char>>(local_260,"wallet",&local_8d2);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x11,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_260);
      std::__cxx11::string::string<std::allocator<char>>(local_280,"wallet",&local_8d3);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x12,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_280);
      std::__cxx11::string::string<std::allocator<char>>(local_2a0,"wallet",&local_8d4);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x13,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_2a0);
      std::__cxx11::string::string<std::allocator<char>>(local_2c0,"wallet",&local_8d5);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x14,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_2c0);
      std::__cxx11::string::string<std::allocator<char>>(local_2e0,"wallet",&local_8d6);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x15,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_2e0);
      std::__cxx11::string::string<std::allocator<char>>(local_300,"wallet",&local_8d7);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x16,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_300);
      std::__cxx11::string::string<std::allocator<char>>(local_320,"wallet",&local_8d8);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x17,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_320);
      std::__cxx11::string::string<std::allocator<char>>(local_340,"wallet",&local_8d9);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x18,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_340);
      std::__cxx11::string::string<std::allocator<char>>(local_360,"wallet",&local_8da);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x19,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_360);
      std::__cxx11::string::string<std::allocator<char>>(local_380,"wallet",&local_8db);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x1a,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_380);
      std::__cxx11::string::string<std::allocator<char>>(local_3a0,"wallet",&local_8dc);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x1b,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_3a0);
      std::__cxx11::string::string<std::allocator<char>>(local_3c0,"wallet",&local_8dd);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x1c,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_3c0);
      std::__cxx11::string::string<std::allocator<char>>(local_3e0,"wallet",&local_8de);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x1d,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_3e0);
      std::__cxx11::string::string<std::allocator<char>>(local_400,"wallet",&local_8df);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x1e,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_400);
      std::__cxx11::string::string<std::allocator<char>>(local_420,"wallet",&local_8e0);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x1f,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_420);
      std::__cxx11::string::string<std::allocator<char>>(local_440,"wallet",&local_8e1);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x20,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_440);
      std::__cxx11::string::string<std::allocator<char>>(local_460,"wallet",&local_8e2);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x21,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_460);
      std::__cxx11::string::string<std::allocator<char>>(local_480,"wallet",&local_8e3);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x22,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_480);
      std::__cxx11::string::string<std::allocator<char>>(local_4a0,"wallet",&local_8e4);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x23,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_4a0);
      std::__cxx11::string::string<std::allocator<char>>(local_4c0,"wallet",&local_8e5);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x24,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_4c0);
      std::__cxx11::string::string<std::allocator<char>>(local_4e0,"wallet",&local_8e6);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x25,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_4e0);
      std::__cxx11::string::string<std::allocator<char>>(local_500,"wallet",&local_8e7);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x26,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_500);
      std::__cxx11::string::string<std::allocator<char>>(local_520,"wallet",&local_8e8);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x27,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_520);
      std::__cxx11::string::string<std::allocator<char>>
                (local_540,"wallet",(allocator<char> *)&stack0xfffffffffffff717);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x28,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_540);
      std::__cxx11::string::string<std::allocator<char>>
                (local_560,"wallet",(allocator<char> *)&stack0xfffffffffffff716);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x29,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_560);
      std::__cxx11::string::string<std::allocator<char>>
                (local_580,"wallet",(allocator<char> *)&stack0xfffffffffffff715);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x2a,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_580);
      std::__cxx11::string::string<std::allocator<char>>
                (local_5a0,"wallet",(allocator<char> *)&stack0xfffffffffffff714);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x2b,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_5a0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_5c0,"wallet",(allocator<char> *)&stack0xfffffffffffff713);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x2c,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_5c0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_5e0,"wallet",(allocator<char> *)&stack0xfffffffffffff712);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x2d,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_5e0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_600,"wallet",(allocator<char> *)&stack0xfffffffffffff711);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x2e,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_600);
      std::__cxx11::string::string<std::allocator<char>>
                (local_620,"wallet",(allocator<char> *)&stack0xfffffffffffff710);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x2f,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_620);
      std::__cxx11::string::string<std::allocator<char>>
                (local_640,"wallet",(allocator<char> *)&stack0xfffffffffffff70f);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x30,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_640);
      std::__cxx11::string::string<std::allocator<char>>
                (local_660,"wallet",(allocator<char> *)&stack0xfffffffffffff70e);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x31,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_660);
      std::__cxx11::string::string<std::allocator<char>>
                (local_680,"wallet",(allocator<char> *)&stack0xfffffffffffff70d);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x32,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_680);
      std::__cxx11::string::string<std::allocator<char>>
                (local_6a0,"wallet",(allocator<char> *)&stack0xfffffffffffff70c);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x33,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_6a0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_6c0,"wallet",(allocator<char> *)&stack0xfffffffffffff70b);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x34,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_6c0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_6e0,"wallet",(allocator<char> *)&stack0xfffffffffffff70a);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x35,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_6e0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_700,"wallet",(allocator<char> *)&stack0xfffffffffffff709);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x36,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_700);
      std::__cxx11::string::string<std::allocator<char>>
                (local_720,"wallet",(allocator<char> *)&stack0xfffffffffffff708);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x37,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_720);
      std::__cxx11::string::string<std::allocator<char>>
                (local_740,"wallet",(allocator<char> *)&stack0xfffffffffffff707);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x38,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_740);
      std::__cxx11::string::string<std::allocator<char>>
                (local_760,"wallet",(allocator<char> *)&stack0xfffffffffffff706);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x39,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_760);
      std::__cxx11::string::string<std::allocator<char>>
                (local_780,"wallet",(allocator<char> *)&stack0xfffffffffffff705);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x3a,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_780);
      std::__cxx11::string::string<std::allocator<char>>
                (local_7a0,"wallet",(allocator<char> *)&stack0xfffffffffffff704);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x3b,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_7a0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_7c0,"wallet",(allocator<char> *)&stack0xfffffffffffff703);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x3c,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_7c0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_7e0,"wallet",(allocator<char> *)&stack0xfffffffffffff702);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x3d,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_7e0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_800,"wallet",(allocator<char> *)&stack0xfffffffffffff701);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x3e,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_800);
      std::__cxx11::string::string<std::allocator<char>>
                (local_820,"wallet",(allocator<char> *)&stack0xfffffffffffff700);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x3f,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_820);
      std::__cxx11::string::string<std::allocator<char>>
                (local_840,"wallet",(allocator<char> *)&stack0xfffffffffffff6ff);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x40,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_840);
      std::__cxx11::string::string<std::allocator<char>>
                (local_860,"wallet",(allocator<char> *)&stack0xfffffffffffff6fe);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x41,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_860);
      std::__cxx11::string::string<std::allocator<char>>
                (local_880,"wallet",(allocator<char> *)&stack0xfffffffffffff6fd);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x42,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_880);
      std::__cxx11::string::string<std::allocator<char>>
                (local_8a0,"wallet",(allocator<char> *)&stack0xfffffffffffff6fc);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x43,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_8a0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_8c0,"wallet",(allocator<char> *)&stack0xfffffffffffff6fb);
      CRPCCommand::CRPCCommand
                (GetWalletRPCCommands::commands + 0x44,in_stack_fffffffffffff6f8,
                 (RpcMethodFnType)local_8c0);
      std::__cxx11::string::~string(local_8c0);
      std::__cxx11::string::~string(local_8a0);
      std::__cxx11::string::~string(local_880);
      std::__cxx11::string::~string(local_860);
      std::__cxx11::string::~string(local_840);
      std::__cxx11::string::~string(local_820);
      std::__cxx11::string::~string(local_800);
      std::__cxx11::string::~string(local_7e0);
      std::__cxx11::string::~string(local_7c0);
      std::__cxx11::string::~string(local_7a0);
      std::__cxx11::string::~string(local_780);
      std::__cxx11::string::~string(local_760);
      std::__cxx11::string::~string(local_740);
      std::__cxx11::string::~string(local_720);
      std::__cxx11::string::~string(local_700);
      std::__cxx11::string::~string(local_6e0);
      std::__cxx11::string::~string(local_6c0);
      std::__cxx11::string::~string(local_6a0);
      std::__cxx11::string::~string(local_680);
      std::__cxx11::string::~string(local_660);
      std::__cxx11::string::~string(local_640);
      std::__cxx11::string::~string(local_620);
      std::__cxx11::string::~string(local_600);
      std::__cxx11::string::~string(local_5e0);
      std::__cxx11::string::~string(local_5c0);
      std::__cxx11::string::~string(local_5a0);
      std::__cxx11::string::~string(local_580);
      std::__cxx11::string::~string(local_560);
      std::__cxx11::string::~string(local_540);
      std::__cxx11::string::~string(local_520);
      std::__cxx11::string::~string(local_500);
      std::__cxx11::string::~string(local_4e0);
      std::__cxx11::string::~string(local_4c0);
      std::__cxx11::string::~string(local_4a0);
      std::__cxx11::string::~string(local_480);
      std::__cxx11::string::~string(local_460);
      std::__cxx11::string::~string(local_440);
      std::__cxx11::string::~string(local_420);
      std::__cxx11::string::~string(local_400);
      std::__cxx11::string::~string(local_3e0);
      std::__cxx11::string::~string(local_3c0);
      std::__cxx11::string::~string(local_3a0);
      std::__cxx11::string::~string(local_380);
      std::__cxx11::string::~string(local_360);
      std::__cxx11::string::~string(local_340);
      std::__cxx11::string::~string(local_320);
      std::__cxx11::string::~string(local_300);
      std::__cxx11::string::~string(local_2e0);
      std::__cxx11::string::~string(local_2c0);
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::string::~string(local_280);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::string::~string(local_200);
      std::__cxx11::string::~string(local_1e0);
      std::__cxx11::string::~string(local_1c0);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string(local_160);
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_40);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&GetWalletRPCCommands()::commands);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    SVar2.m_size = 0x45;
    SVar2.m_data = GetWalletRPCCommands::commands;
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

Span<const CRPCCommand> GetWalletRPCCommands()
{
    static const CRPCCommand commands[]{
        {"rawtransactions", &fundrawtransaction},
        {"wallet", &abandontransaction},
        {"wallet", &abortrescan},
        {"wallet", &addmultisigaddress},
        {"wallet", &backupwallet},
        {"wallet", &bumpfee},
        {"wallet", &psbtbumpfee},
        {"wallet", &createwallet},
        {"wallet", &createwalletdescriptor},
        {"wallet", &restorewallet},
        {"wallet", &dumpprivkey},
        {"wallet", &dumpwallet},
        {"wallet", &encryptwallet},
        {"wallet", &getaddressesbylabel},
        {"wallet", &getaddressinfo},
        {"wallet", &getbalance},
        {"wallet", &gethdkeys},
        {"wallet", &getnewaddress},
        {"wallet", &getrawchangeaddress},
        {"wallet", &getreceivedbyaddress},
        {"wallet", &getreceivedbylabel},
        {"wallet", &gettransaction},
        {"wallet", &getunconfirmedbalance},
        {"wallet", &getbalances},
        {"wallet", &getwalletinfo},
        {"wallet", &importaddress},
        {"wallet", &importdescriptors},
        {"wallet", &importmulti},
        {"wallet", &importprivkey},
        {"wallet", &importprunedfunds},
        {"wallet", &importpubkey},
        {"wallet", &importwallet},
        {"wallet", &keypoolrefill},
        {"wallet", &listaddressgroupings},
        {"wallet", &listdescriptors},
        {"wallet", &listlabels},
        {"wallet", &listlockunspent},
        {"wallet", &listreceivedbyaddress},
        {"wallet", &listreceivedbylabel},
        {"wallet", &listsinceblock},
        {"wallet", &listtransactions},
        {"wallet", &listunspent},
        {"wallet", &listwalletdir},
        {"wallet", &listwallets},
        {"wallet", &loadwallet},
        {"wallet", &lockunspent},
        {"wallet", &migratewallet},
        {"wallet", &newkeypool},
        {"wallet", &removeprunedfunds},
        {"wallet", &rescanblockchain},
        {"wallet", &send},
        {"wallet", &sendmany},
        {"wallet", &sendtoaddress},
        {"wallet", &sethdseed},
        {"wallet", &setlabel},
        {"wallet", &settxfee},
        {"wallet", &setwalletflag},
        {"wallet", &signmessage},
        {"wallet", &signrawtransactionwithwallet},
        {"wallet", &simulaterawtransaction},
        {"wallet", &sendall},
        {"wallet", &unloadwallet},
        {"wallet", &upgradewallet},
        {"wallet", &walletcreatefundedpsbt},
#ifdef ENABLE_EXTERNAL_SIGNER
        {"wallet", &walletdisplayaddress},
#endif // ENABLE_EXTERNAL_SIGNER
        {"wallet", &walletlock},
        {"wallet", &walletpassphrase},
        {"wallet", &walletpassphrasechange},
        {"wallet", &walletprocesspsbt},
    };
    return commands;
}